

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O2

uint __thiscall o3dgc::Arithmetic_Codec::decode(Arithmetic_Codec *this,Static_Data_Model *M)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar8 = this->length;
  if (M->decoder_table == (uint *)0x0) {
    uVar7 = uVar8 >> 0xf;
    this->length = uVar7;
    uVar4 = M->data_symbols;
    uVar9 = uVar4 >> 1;
    uVar6 = this->value;
    uVar3 = 0;
    uVar5 = 0;
    do {
      uVar10 = M->distribution[uVar9] * uVar7;
      uVar2 = uVar9;
      if (uVar10 <= uVar6) {
        uVar2 = uVar4;
        uVar3 = uVar10;
        uVar10 = uVar8;
        uVar5 = uVar9;
      }
      uVar8 = uVar10;
      uVar4 = uVar2;
      uVar9 = uVar5 + uVar4 >> 1;
    } while (uVar9 != uVar5);
  }
  else {
    uVar6 = this->value;
    uVar7 = uVar8 >> 0xf;
    this->length = uVar7;
    uVar4 = uVar6 / uVar7 >> ((byte)M->table_shift & 0x1f);
    puVar1 = M->distribution;
    uVar5 = M->decoder_table[uVar4];
    uVar4 = M->decoder_table[uVar4 + 1] + 1;
    while (uVar3 = uVar4, uVar5 + 1 < uVar3) {
      uVar4 = uVar3 + uVar5 >> 1;
      if (puVar1[uVar4] <= uVar6 / uVar7) {
        uVar5 = uVar4;
        uVar4 = uVar3;
      }
    }
    uVar3 = puVar1[uVar5] * uVar7;
    if (uVar5 != M->last_symbol) {
      uVar8 = uVar7 * puVar1[uVar5 + 1];
    }
  }
  this->value = uVar6 - uVar3;
  this->length = uVar8 - uVar3;
  if (uVar8 - uVar3 < 0x1000000) {
    renorm_dec_interval(this);
  }
  return uVar5;
}

Assistant:

unsigned Arithmetic_Codec::decode(Static_Data_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
    #endif

      unsigned n, s, x, y = length;

      if (M.decoder_table) {              // use table look-up for faster decoding

        unsigned dv = value / (length >>= DM__LengthShift);
        unsigned t = dv >> M.table_shift;

        s = M.decoder_table[t];         // initial decision based on table look-up
        n = M.decoder_table[t+1] + 1;

        while (n > s + 1) {                        // finish with bisection search
          unsigned m = (s + n) >> 1;
          if (M.distribution[m] > dv) n = m; else s = m;
        }
                                                               // compute products
        x = M.distribution[s] * length;
        if (s != M.last_symbol) y = M.distribution[s+1] * length;
      }

      else {                                  // decode using only multiplications

        x = s = 0;
        length >>= DM__LengthShift;
        unsigned m = (n = M.data_symbols) >> 1;
                                                    // decode via bisection search
        do {
          unsigned z = length * M.distribution[m];
          if (z > value) {
            n = m;
            y = z;                                             // value is smaller
          }
          else {
            s = m;
            x = z;                                     // value is larger or equal
          }
        } while ((m = (s + n) >> 1) != s);
      }

      value -= x;                                               // update interval
      length = y - x;

      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      return s;
    }